

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqfuncstate.cpp
# Opt level: O1

void __thiscall
SQFuncState::SQFuncState
          (SQFuncState *this,SQSharedState *ss,SQFuncState *parent,CompilerErrorFunc efunc,void *ed)

{
  SQUnsignedInteger *pSVar1;
  SQObjectType SVar2;
  SQTable *pSVar3;
  SQTable *pSVar4;
  
  (this->_literals).super_SQObject._unVal.pTable = (SQTable *)0x0;
  (this->_vlocals)._vals = (SQLocalVarInfo *)0x0;
  (this->_vlocals)._size = 0;
  (this->_vlocals)._allocated = 0;
  (this->_targetstack)._vals = (longlong *)0x0;
  (this->_targetstack)._size = 0;
  (this->_targetstack)._allocated = 0;
  memset(&this->_unresolvedbreaks,0,0xa8);
  (this->_literals).super_SQObject._type = OT_NULL;
  (this->_literals).super_SQObject._unVal.pTable = (SQTable *)0x0;
  (this->_strings).super_SQObject._unVal.pTable = (SQTable *)0x0;
  (this->_strings).super_SQObject._type = OT_NULL;
  (this->_name).super_SQObject._unVal.pTable = (SQTable *)0x0;
  (this->_name).super_SQObject._type = OT_NULL;
  (this->_sourcename).super_SQObject._type = OT_NULL;
  (this->_childstates)._vals = (SQFuncState **)0x0;
  (this->_childstates)._size = 0;
  (this->_childstates)._allocated = 0;
  (this->_sourcename).super_SQObject._unVal.pTable = (SQTable *)0x0;
  this->_nliterals = 0;
  (this->_lineinfos)._vals = (SQLineInfo *)0x0;
  (this->_lineinfos)._size = 0;
  (this->_lineinfos)._allocated = 0;
  (this->_scope_blocks)._vals = (longlong *)0x0;
  (this->_scope_blocks)._size = 0;
  (this->_scope_blocks)._allocated = 0;
  (this->_breaktargets)._vals = (longlong *)0x0;
  (this->_breaktargets)._size = 0;
  (this->_breaktargets)._allocated = 0;
  (this->_continuetargets)._vals = (longlong *)0x0;
  (this->_continuetargets)._size = 0;
  (this->_continuetargets)._allocated = 0;
  (this->_defaultparams)._vals = (longlong *)0x0;
  (this->_defaultparams)._size = 0;
  (this->_defaultparams)._allocated = 0;
  pSVar4 = (SQTable *)sq_vm_malloc(0x58);
  SQTable::SQTable(pSVar4,ss,0);
  (pSVar4->super_SQDelegable)._delegate = (SQTable *)0x0;
  pSVar3 = (this->_literals).super_SQObject._unVal.pTable;
  SVar2 = (this->_literals).super_SQObject._type;
  (this->_literals).super_SQObject._type = OT_TABLE;
  (this->_literals).super_SQObject._unVal.pTable = pSVar4;
  pSVar1 = &(pSVar4->super_SQDelegable).super_SQCollectable.super_SQRefCounted._uiRef;
  *pSVar1 = *pSVar1 + 1;
  if ((SVar2 >> 0x1b & 1) != 0) {
    pSVar1 = &(pSVar3->super_SQDelegable).super_SQCollectable.super_SQRefCounted._uiRef;
    *pSVar1 = *pSVar1 - 1;
    if (*pSVar1 == 0) {
      (*(pSVar3->super_SQDelegable).super_SQCollectable.super_SQRefCounted._vptr_SQRefCounted[2])();
    }
  }
  pSVar4 = (SQTable *)sq_vm_malloc(0x58);
  SQTable::SQTable(pSVar4,ss,0);
  (pSVar4->super_SQDelegable)._delegate = (SQTable *)0x0;
  pSVar3 = (this->_strings).super_SQObject._unVal.pTable;
  SVar2 = (this->_strings).super_SQObject._type;
  (this->_strings).super_SQObject._type = OT_TABLE;
  (this->_strings).super_SQObject._unVal.pTable = pSVar4;
  pSVar1 = &(pSVar4->super_SQDelegable).super_SQCollectable.super_SQRefCounted._uiRef;
  *pSVar1 = *pSVar1 + 1;
  if ((SVar2 >> 0x1b & 1) != 0) {
    pSVar1 = &(pSVar3->super_SQDelegable).super_SQCollectable.super_SQRefCounted._uiRef;
    *pSVar1 = *pSVar1 - 1;
    if (*pSVar1 == 0) {
      (*(pSVar3->super_SQDelegable).super_SQCollectable.super_SQRefCounted._vptr_SQRefCounted[2])();
    }
  }
  this->_sharedstate = ss;
  this->_lastline = 0;
  this->_optimization = true;
  this->_parent = parent;
  this->_stacksize = 0;
  this->_traps = 0;
  this->_outers = 0;
  this->_returnexp = 0;
  this->_varparams = false;
  this->_bgenerator = false;
  this->_errfunc = efunc;
  this->_errtarget = ed;
  this->_ss = ss;
  return;
}

Assistant:

SQFuncState::SQFuncState(SQSharedState *ss,SQFuncState *parent,CompilerErrorFunc efunc,void *ed)
{
        _nliterals = 0;
        _literals = SQTable::Create(ss,0);
        _strings =  SQTable::Create(ss,0);
        _sharedstate = ss;
        _lastline = 0;
        _optimization = true;
        _parent = parent;
        _stacksize = 0;
        _traps = 0;
        _returnexp = 0;
        _varparams = false;
        _errfunc = efunc;
        _errtarget = ed;
        _bgenerator = false;
        _outers = 0;
        _ss = ss;

}